

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::Clear
          (SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *this)

{
  HeapAllocator *this_00;
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *pSVar1;
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *buffer;
  
  this_00 = this->allocator;
  buffer = (SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
           (this->
           super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>).
           super_SListNodeBase<Memory::HeapAllocator>.next;
  while (buffer != this) {
    pSVar1 = (SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
             (buffer->
             super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>)
             .super_SListNodeBase<Memory::HeapAllocator>.next;
    Memory::HeapAllocator::Free(this_00,buffer,0x20);
    buffer = pSVar1;
  }
  (this->super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>).
  super_SListNodeBase<Memory::HeapAllocator>.next = (Type)this;
  (this->super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>).
  super_RealCount.count = 0;
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }